

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcMinBase.c
# Opt level: O0

int Abc_NodeCollapse1(Abc_Obj_t *pFanin,Abc_Obj_t *pFanout,Vec_Ptr_t *vFanins,int *pPermFanin,
                     int *pPermFanout)

{
  int iVar1;
  Hop_Obj_t *pHVar2;
  Abc_Obj_t *pObj_00;
  Abc_Obj_t *pFanin_00;
  int local_54;
  int i;
  Hop_Obj_t *bFanoutNew;
  Abc_Obj_t *pObj;
  Abc_Obj_t *pFanoutNew;
  int *pPermFanout_local;
  int *pPermFanin_local;
  Vec_Ptr_t *vFanins_local;
  Abc_Obj_t *pFanout_local;
  Abc_Obj_t *pFanin_local;
  
  iVar1 = Abc_NtkIsAigLogic(pFanin->pNtk);
  if (iVar1 == 0) {
    __assert_fail("Abc_NtkIsAigLogic(pFanin->pNtk)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abc/abcMinBase.c"
                  ,0x239,
                  "int Abc_NodeCollapse1(Abc_Obj_t *, Abc_Obj_t *, Vec_Ptr_t *, int *, int *)");
  }
  iVar1 = Abc_ObjIsNode(pFanin);
  if (iVar1 == 0) {
    __assert_fail("Abc_ObjIsNode(pFanin)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abc/abcMinBase.c"
                  ,0x23a,
                  "int Abc_NodeCollapse1(Abc_Obj_t *, Abc_Obj_t *, Vec_Ptr_t *, int *, int *)");
  }
  iVar1 = Abc_ObjIsNode(pFanout);
  if (iVar1 == 0) {
    __assert_fail("Abc_ObjIsNode(pFanout)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abc/abcMinBase.c"
                  ,0x23b,
                  "int Abc_NodeCollapse1(Abc_Obj_t *, Abc_Obj_t *, Vec_Ptr_t *, int *, int *)");
  }
  pHVar2 = Abc_NodeCollapseFunc1(pFanin,pFanout,vFanins,pPermFanin,pPermFanout);
  if (pHVar2 == (Hop_Obj_t *)0x0) {
    pFanin_local._4_4_ = 0;
  }
  else {
    pObj_00 = Abc_NtkCreateNode(pFanin->pNtk);
    for (local_54 = 0; iVar1 = Vec_PtrSize(vFanins), local_54 < iVar1; local_54 = local_54 + 1) {
      pFanin_00 = (Abc_Obj_t *)Vec_PtrEntry(vFanins,local_54);
      Abc_ObjAddFanin(pObj_00,pFanin_00);
    }
    (pObj_00->field_5).pData = pHVar2;
    Abc_ObjTransferFanout(pFanout,pObj_00);
    iVar1 = Abc_ObjFanoutNum(pFanout);
    if (iVar1 != 0) {
      __assert_fail("Abc_ObjFanoutNum( pFanout ) == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abc/abcMinBase.c"
                    ,0x246,
                    "int Abc_NodeCollapse1(Abc_Obj_t *, Abc_Obj_t *, Vec_Ptr_t *, int *, int *)");
    }
    Abc_NtkDeleteObj_rec(pFanout,1);
    pFanin_local._4_4_ = 1;
  }
  return pFanin_local._4_4_;
}

Assistant:

int Abc_NodeCollapse1( Abc_Obj_t * pFanin, Abc_Obj_t * pFanout, Vec_Ptr_t * vFanins, int * pPermFanin, int * pPermFanout )
{
    Abc_Obj_t * pFanoutNew, * pObj;
    Hop_Obj_t * bFanoutNew;
    int i;
    assert( Abc_NtkIsAigLogic(pFanin->pNtk) );
    assert( Abc_ObjIsNode(pFanin) );
    assert( Abc_ObjIsNode(pFanout) );
    bFanoutNew = Abc_NodeCollapseFunc1( pFanin, pFanout, vFanins, pPermFanin, pPermFanout );  
    if ( bFanoutNew == NULL )
        return 0;
    // create the new node
    pFanoutNew = Abc_NtkCreateNode( pFanin->pNtk );
    Vec_PtrForEachEntry( Abc_Obj_t *, vFanins, pObj, i )
        Abc_ObjAddFanin( pFanoutNew, pObj );
    pFanoutNew->pData = bFanoutNew;
    // transfer the fanout
    Abc_ObjTransferFanout( pFanout, pFanoutNew );
    assert( Abc_ObjFanoutNum( pFanout ) == 0 );
    Abc_NtkDeleteObj_rec( pFanout, 1 );
    return 1;
}